

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::~PoolAllocator(PoolAllocator *this)

{
  undefined8 *puVar1;
  ulong extraout_RAX;
  pthread_mutex_t *__mutex;
  undefined8 *puVar2;
  pthread_mutex_t *local_28;
  undefined8 *local_20;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_00367bb0;
  clear(this);
  __mutex = (pthread_mutex_t *)this->d;
  puVar2 = *(undefined8 **)((long)__mutex + 0x70);
  if ((*(undefined8 **)((long)__mutex + 0x70) == (undefined8 *)((long)__mutex + 0x70)) ||
     (~PoolAllocator((PoolAllocator *)&this->d), __mutex = local_28, puVar2 = local_20,
     (extraout_RAX & 1) != 0)) {
    while (puVar2 != (undefined8 *)((long)__mutex + 0x70)) {
      puVar1 = (undefined8 *)*puVar2;
      operator_delete(puVar2,0x20);
      puVar2 = puVar1;
    }
    puVar2 = *(undefined8 **)((long)__mutex + 0x58);
    while (puVar2 != (undefined8 *)((long)__mutex + 0x58)) {
      puVar1 = (undefined8 *)*puVar2;
      operator_delete(puVar2,0x20);
      puVar2 = puVar1;
    }
    pthread_mutex_destroy(__mutex + 1);
    pthread_mutex_destroy(__mutex);
  }
  else {
    __mutex = (pthread_mutex_t *)0x0;
  }
  operator_delete(__mutex,0x88);
  return;
}

Assistant:

PoolAllocator::~PoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}